

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

void mod2dense_print(FILE *f,mod2dense *m)

{
  uint uVar1;
  int row;
  int col;
  
  for (row = 0; row < m->n_rows; row = row + 1) {
    for (col = 0; col < m->n_cols; col = col + 1) {
      uVar1 = mod2dense_get(m,row,col);
      fprintf((FILE *)f," %d",(ulong)uVar1);
    }
    fputc(10,(FILE *)f);
  }
  return;
}

Assistant:

void mod2dense_print     
( FILE *f,
  mod2dense *m
)
{ 
  int i, j;

  for (i = 0; i<mod2dense_rows(m); i++)
  { for (j = 0; j<mod2dense_cols(m); j++)
    { fprintf(f," %d",mod2dense_get(m,i,j));
    }
    fprintf(f,"\n");
  }
}